

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void stat_update_tree(nni_stat *stat,nni_mtx **mtxp)

{
  nni_stat *local_20;
  nni_stat *child;
  nni_mtx **mtxp_local;
  nni_stat *stat_local;
  
  stat_update(stat,mtxp);
  for (local_20 = (nni_stat *)nni_list_first(&stat->s_children); local_20 != (nni_stat *)0x0;
      local_20 = (nni_stat *)nni_list_next(&stat->s_children,local_20)) {
    stat_update_tree(local_20,mtxp);
  }
  return;
}

Assistant:

static void
stat_update_tree(nni_stat *stat, nni_mtx **mtxp)
{
	nni_stat *child;
	stat_update(stat, mtxp);
	NNI_LIST_FOREACH (&stat->s_children, child) {
		stat_update_tree(child, mtxp);
	}
}